

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

wchar_t tree_next(tree *t)

{
  wchar_t wVar1;
  wchar_t local_20;
  wchar_t r;
  tree *t_local;
  
  while( true ) {
    while( true ) {
      if (t->stack == (tree_entry *)0x0) {
        t->visit_type = 0;
        return L'\0';
      }
      if (t->d == (DIR *)0x0) break;
      wVar1 = tree_dir_next_posix(t);
      if (wVar1 != L'\0') {
        return wVar1;
      }
    }
    if ((t->stack->flags & 4U) != 0) break;
    if ((t->stack->flags & 8U) != 0) {
      t->current = t->stack;
      tree_append(t,(t->stack->name).s,(t->stack->name).length);
      t->stack->flags = t->stack->flags & 0xfffffff7;
      wVar1 = tree_descent(t);
      if (wVar1 == L'\0') {
        t->visit_type = 2;
      }
      else {
        tree_pop(t);
        t->visit_type = wVar1;
      }
      return t->visit_type;
    }
    if ((t->stack->flags & 0x10U) == 0) {
      if ((t->stack->flags & 0x20U) != 0) {
        local_20 = tree_ascend(t);
        tree_pop(t);
        if (local_20 == L'\0') {
          local_20 = L'\x03';
        }
        t->visit_type = local_20;
        return t->visit_type;
      }
      tree_pop(t);
      t->flags = t->flags & 0xffffffdf;
      t->flags = t->flags & 0xffffffef;
    }
    else {
      t->stack->flags = t->stack->flags & 0xffffffef;
      wVar1 = tree_dir_next_posix(t);
      if (wVar1 != L'\0') {
        return wVar1;
      }
    }
  }
  t->current = t->stack;
  tree_append(t,(t->stack->name).s,(t->stack->name).length);
  t->stack->flags = t->stack->flags & 0xfffffffb;
  t->visit_type = 1;
  return L'\x01';
}

Assistant:

static int
tree_next(struct tree *t)
{
	int r;

	while (t->stack != NULL) {
		/* If there's an open dir, get the next entry from there. */
		if (t->d != INVALID_DIR_HANDLE) {
			r = tree_dir_next_posix(t);
			if (r == 0)
				continue;
			return (r);
		}

		if (t->stack->flags & needsFirstVisit) {
			/* Top stack item needs a regular visit. */
			t->current = t->stack;
			tree_append(t, t->stack->name.s,
			    archive_strlen(&(t->stack->name)));
			/* t->dirname_length = t->path_length; */
			/* tree_pop(t); */
			t->stack->flags &= ~needsFirstVisit;
			return (t->visit_type = TREE_REGULAR);
		} else if (t->stack->flags & needsDescent) {
			/* Top stack item is dir to descend into. */
			t->current = t->stack;
			tree_append(t, t->stack->name.s,
			    archive_strlen(&(t->stack->name)));
			t->stack->flags &= ~needsDescent;
			r = tree_descent(t);
			if (r != 0) {
				tree_pop(t);
				t->visit_type = r;
			} else
				t->visit_type = TREE_POSTDESCENT;
			return (t->visit_type);
		} else if (t->stack->flags & needsOpen) {
			t->stack->flags &= ~needsOpen;
			r = tree_dir_next_posix(t);
			if (r == 0)
				continue;
			return (r);
		} else if (t->stack->flags & needsAscent) {
		        /* Top stack item is dir and we're done with it. */
			r = tree_ascend(t);
			tree_pop(t);
			t->visit_type = r != 0 ? r : TREE_POSTASCENT;
			return (t->visit_type);
		} else {
			/* Top item on stack is dead. */
			tree_pop(t);
			t->flags &= ~hasLstat;
			t->flags &= ~hasStat;
		}
	}
	return (t->visit_type = 0);
}